

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall
serialize_tests::Base::
Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
          (Base *this,
          ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
          *s)

{
  undefined8 uVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  string_view str;
  string hex;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_68;
  char local_50;
  long *local_48;
  void *local_40;
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (s->m_params->m_base_format == RAW) {
    DataStream::read((s->m_substream).m_substream.m_substream,(int)&local_48,(void *)0x1,in_RCX);
    this->m_base_data = (uint8_t)local_48._0_1_;
  }
  else {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"aa","");
    DataStream::read((s->m_substream).m_substream.m_substream,(int)local_48,local_40,in_RCX);
    str._M_str = (char *)local_48;
    str._M_len = (size_t)local_40;
    TryParseHex<unsigned_char>
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               &local_68._M_value,str);
    if (local_50 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00631ba6;
    }
    if (local_68._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        uVar1 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        if (local_48 != local_38) {
          operator_delete(local_48,local_38[0] + 1);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          _Unwind_Resume(uVar1);
        }
      }
      goto LAB_00631ba6;
    }
    this->m_base_data =
         *local_68._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
    local_50 = '\0';
    operator_delete(local_68._M_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68._M_value.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_68._0_8_);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00631ba6:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        if (s.template GetParams<BaseFormat>().m_base_format == BaseFormat::RAW) {
            s >> m_base_data;
        } else {
            std::string hex{"aa"};
            s >> Span{hex}.first(hex.size());
            m_base_data = TryParseHex<uint8_t>(hex).value().at(0);
        }
    }